

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

uint If_DsdSign_rec(If_DsdMan_t *p,If_DsdObj_t *pObj,int *pnSupp)

{
  int iVar1;
  uint uVar2;
  If_DsdObj_t *pObj_00;
  uint uVar3;
  uint i;
  
  uVar2 = *(uint *)&pObj->field_0x4;
  if ((uVar2 & 7) == 2) {
    iVar1 = *pnSupp;
    *pnSupp = iVar1 + 1;
    uVar3 = 1 << ((char)iVar1 * '\x02' & 0x1fU);
  }
  else {
    uVar3 = 0;
    for (i = 0; i < uVar2 >> 0x1b; i = i + 1) {
      pObj_00 = If_DsdObjFanin(&p->vObjs,pObj,i);
      if (pObj_00 == (If_DsdObj_t *)0x0) {
        return uVar3;
      }
      uVar2 = If_DsdSign_rec(p,pObj_00,pnSupp);
      uVar3 = uVar3 | uVar2;
      uVar2 = *(uint *)&pObj->field_0x4;
    }
  }
  return uVar3;
}

Assistant:

unsigned If_DsdSign_rec( If_DsdMan_t * p, If_DsdObj_t * pObj, int * pnSupp )
{
    unsigned uSign = 0; int i;
    If_DsdObj_t * pFanin;
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return (1 << (2*(*pnSupp)++));
    If_DsdObjForEachFanin( &p->vObjs, pObj, pFanin, i )
        uSign |= If_DsdSign_rec( p, pFanin, pnSupp );
    return uSign;
}